

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::PrintTimeScaleTask::bindArgument
          (PrintTimeScaleTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Scope *pSVar1;
  Compilation *this_00;
  bool bVar2;
  Expression *pEVar3;
  Compilation *compilation;
  InvalidExpression *pIVar4;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  SourceRange sourceRange;
  void *local_20;
  
  extraLookupFlags.m_bits = (underlying_type)args;
  if (argIndex != 0) {
    pEVar3 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
    return pEVar3;
  }
  pSVar1 = (context->scope).ptr;
  if (pSVar1 != (Scope *)0x0) {
    this_00 = pSVar1->compilation;
    bVar2 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    if (bVar2) {
      compilation = (Compilation *)
                    slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                              (&syntax->super_SyntaxNode);
      pEVar3 = HierarchicalReferenceExpression::fromSyntax
                         ((HierarchicalReferenceExpression *)this_00,compilation,
                          (NameSyntax *)context,(ASTContext *)0x0,extraLookupFlags);
      return pEVar3;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0xc000b,sourceRange);
    local_20 = (void *)0x0;
    pIVar4 = BumpAllocator::
             emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                       (&this_00->super_BumpAllocator,&local_20,this_00->errorType);
    return &pIVar4->super_Expression;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
            );
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex == 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModuleName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            return HierarchicalReferenceExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                               context);
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }